

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::descriptor_unittest::FeaturesDebugStringTest::LoadFile
          (FeaturesDebugStringTest *this,string_view name,string_view content)

{
  string_view v;
  bool bVar1;
  int iVar2;
  FileDescriptor *pFVar3;
  LogMessage *this_00;
  Nonnull<const_char_*> failure_msg;
  string_view str;
  SimpleErrorCollector error_collector;
  Parser parser;
  ArrayInputStream input_stream;
  FileDescriptorProto proto;
  Tokenizer tokenizer;
  LogMessage LStack_2d8;
  size_t local_2c8;
  char *local_2c0;
  ErrorCollector local_2b8;
  string local_2b0;
  Parser local_290;
  ArrayInputStream local_208;
  undefined1 local_1e8 [248];
  Tokenizer local_f0;
  
  local_2c0 = content._M_str;
  local_2c8 = content._M_len;
  io::ArrayInputStream::ArrayInputStream(&local_208,local_2c0,(int)content._M_len,-1);
  local_2b8._vptr_ErrorCollector = (_func_int **)&PTR__SimpleErrorCollector_018821d0;
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  io::Tokenizer::Tokenizer(&local_f0,&local_208.super_ZeroCopyInputStream,&local_2b8);
  compiler::Parser::Parser(&local_290);
  local_290.error_collector_ = &local_2b8;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1e8,(Arena *)0x0);
  bVar1 = compiler::Parser::Parse(&local_290,&local_f0,(FileDescriptorProto *)local_1e8);
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)&local_2b0);
    if (iVar2 == 0) {
      local_1e8[0x10] = local_1e8[0x10] | 1;
      if ((local_1e8._8_8_ & 1) != 0) {
        local_1e8._8_8_ = *(undefined8 *)(local_1e8._8_8_ & 0xfffffffffffffffe);
      }
      protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)(local_1e8 + 200),name,(Arena *)local_1e8._8_8_);
      pFVar3 = DescriptorPool::BuildFile(&this->roundtrip_pool_,(FileDescriptorProto *)local_1e8);
      if (pFVar3 != (FileDescriptor *)0x0) {
        FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1e8);
        compiler::Parser::~Parser(&local_290);
        io::Tokenizer::~Tokenizer(&local_f0);
        local_2b8._vptr_ErrorCollector = (_func_int **)&PTR__SimpleErrorCollector_018821d0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,
                          CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                                   local_2b0.field_2._M_local_buf[0]) + 1);
        }
        io::ErrorCollector::~ErrorCollector(&local_2b8);
        return pFVar3;
      }
      absl::lts_20250127::log_internal::DieBecauseNull
                ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x2f0a,"roundtrip_pool_.BuildFile(proto)");
    }
    failure_msg = absl::lts_20250127::log_internal::
                  MakeCheckOpString<char_const*,std::__cxx11::string_const&>
                            (anon_var_dwarf_a22956 + 5,&local_2b0,
                             "\"\" == error_collector.last_error()");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2f08,failure_msg);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2f05,"parser.Parse(&tokenizer, &proto)");
    this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_2d8,&local_2b0);
    str._M_str = "\n";
    str._M_len = 1;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str);
    v._M_str = local_2c0;
    v._M_len = local_2c8;
    absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&LStack_2d8);
}

Assistant:

const FileDescriptor* LoadFile(absl::string_view name,
                                 absl::string_view content) {
    io::ArrayInputStream input_stream(content.data(), content.size());
    SimpleErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    compiler::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto proto;
    ABSL_CHECK(parser.Parse(&tokenizer, &proto))
        << error_collector.last_error() << "\n"
        << content;
    ABSL_CHECK_EQ("", error_collector.last_error());
    proto.set_name(name);
    return ABSL_DIE_IF_NULL(roundtrip_pool_.BuildFile(proto));
  }